

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimizedInterleavePatterns.cpp
# Opt level: O0

Box2i anon_unknown.dwarf_1d2162::writefile(Schema *scheme,FrameBuffer *buf,bool tiny)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  undefined4 *puVar6;
  char *pcVar7;
  byte in_CL;
  Vec2<int> extraout_RDX;
  long in_RSI;
  Vec2<int> in_RDI;
  Box2i BVar8;
  OutputFile f;
  FrameBuffer dummy2;
  FrameBuffer dummy1;
  Header hdr;
  int width;
  int height;
  Box<Imath_3_2::Vec2<int>_> *pBVar9;
  undefined8 in_stack_fffffffffffffda0;
  Schema *this;
  undefined4 uVar10;
  undefined4 in_stack_fffffffffffffdb4;
  Schema *this_00;
  undefined1 local_130 [88];
  Schema local_d8;
  Box<Imath_3_2::Vec2<int>_> local_a8 [3];
  undefined1 in_stack_ffffffffffffff97;
  Vec2<float> in_stack_ffffffffffffff98;
  PixelType *in_stack_ffffffffffffffa0;
  char **in_stack_ffffffffffffffa8;
  char **in_stack_ffffffffffffffb0;
  Header *in_stack_ffffffffffffffb8;
  FrameBuffer *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar11;
  int banks;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffda0 >> 0x20);
  banks = 0x80;
  uVar11 = 0x80;
  Imath_3_2::Vec2<float>::Vec2((Vec2<float> *)&stack0xffffffffffffff98,0.0,0.0);
  Imf_3_2::Header::Header
            ((Header *)&stack0xffffffffffffffa0,0x80,0x80,1.0,(Vec2 *)&stack0xffffffffffffff98,1.0,
             INCREASING_Y,ZIP_COMPRESSION);
  iVar1 = random_int(iVar3);
  piVar4 = (int *)Imf_3_2::Header::dataWindow();
  *piVar4 = iVar1 + -100;
  iVar1 = random_int(iVar3);
  lVar5 = Imf_3_2::Header::dataWindow();
  *(int *)(lVar5 + 4) = iVar1 + -100;
  if ((in_CL & 1) == 0) {
    piVar4 = (int *)Imf_3_2::Header::dataWindow();
    iVar1 = *piVar4;
    iVar2 = random_int(iVar3);
    lVar5 = Imf_3_2::Header::dataWindow();
    *(int *)(lVar5 + 8) = iVar1 + 0x40 + iVar2;
    lVar5 = Imf_3_2::Header::dataWindow();
    iVar1 = *(int *)(lVar5 + 4);
    iVar3 = random_int(iVar3);
    lVar5 = Imf_3_2::Header::dataWindow();
    *(int *)(lVar5 + 0xc) = iVar1 + 0x40 + iVar3;
  }
  else {
    piVar4 = (int *)Imf_3_2::Header::dataWindow();
    iVar1 = *piVar4;
    iVar2 = random_int(iVar3);
    lVar5 = Imf_3_2::Header::dataWindow();
    *(int *)(lVar5 + 8) = iVar1 + 1 + iVar2;
    lVar5 = Imf_3_2::Header::dataWindow();
    iVar1 = *(int *)(lVar5 + 4);
    iVar3 = random_int(iVar3);
    lVar5 = Imf_3_2::Header::dataWindow();
    *(int *)(lVar5 + 0xc) = iVar1 + 1 + iVar3;
  }
  puVar6 = (undefined4 *)Imf_3_2::Header::compression();
  *puVar6 = 2;
  pBVar9 = local_a8;
  Imf_3_2::FrameBuffer::FrameBuffer((FrameBuffer *)0x203866);
  this = &local_d8;
  Imf_3_2::FrameBuffer::FrameBuffer((FrameBuffer *)0x203878);
  uVar10 = 1;
  this_00 = this;
  setupBuffer(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
              in_stack_ffffffffffffffa0,(FrameBuffer *)in_stack_ffffffffffffff98,
              in_stack_ffffffffffffffd0,(FrameBuffer *)CONCAT44(uVar11,in_stack_ffffffffffffffd8),
              banks,(bool)in_stack_ffffffffffffff97);
  Imf_3_2::Header::channels();
  Imf_3_2::ChannelList::operator=((ChannelList *)this,(ChannelList *)pBVar9);
  Imf_3_2::ChannelList::~ChannelList((ChannelList *)0x203901);
  if (*(long *)(in_RSI + 0x20) != 0) {
    (anonymous_namespace)::Schema::views_abi_cxx11_(this_00);
    Imf_3_2::addMultiView((Header *)&stack0xffffffffffffffa0,(vector *)(local_130 + 0x10));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffdb4,uVar10));
  }
  pcVar7 = (char *)std::__cxx11::string::c_str();
  remove(pcVar7);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::OutputFile::OutputFile
            ((OutputFile *)local_130,pcVar7,(Header *)&stack0xffffffffffffffa0,iVar1);
  Imf_3_2::OutputFile::setFrameBuffer((FrameBuffer *)local_130);
  Imf_3_2::Header::dataWindow();
  Imf_3_2::Header::dataWindow();
  Imf_3_2::OutputFile::writePixels((int)local_130);
  Imf_3_2::Header::dataWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box((Box<Imath_3_2::Vec2<int>_> *)this,pBVar9);
  Imf_3_2::OutputFile::~OutputFile((OutputFile *)local_130);
  Imf_3_2::FrameBuffer::~FrameBuffer((FrameBuffer *)0x203ab3);
  Imf_3_2::FrameBuffer::~FrameBuffer((FrameBuffer *)0x203ac0);
  Imf_3_2::Header::~Header((Header *)&stack0xffffffffffffffa0);
  BVar8.max = extraout_RDX;
  BVar8.min = in_RDI;
  return BVar8;
}

Assistant:

Box2i
writefile (Schema& scheme, FrameBuffer& buf, bool tiny)
{
    const int height = 128;
    const int width  = 128;

    Header hdr (width, height, 1);

    //min values in range [-100,100]
    hdr.dataWindow ().min.x = random_int (201) - 100;
    hdr.dataWindow ().min.y = random_int (201) - 100;

    // in tiny mode, make image up to 14*14 pixels (less than two SSE instructions)
    if (tiny)
    {
        hdr.dataWindow ().max.x = hdr.dataWindow ().min.x + 1 + random_int (14);
        hdr.dataWindow ().max.y = hdr.dataWindow ().min.y + 1 + random_int (14);
    }
    else
    {
        // in normal mode, make chunky images
        hdr.dataWindow ().max.x =
            hdr.dataWindow ().min.x + 64 + random_int (400);
        hdr.dataWindow ().max.y =
            hdr.dataWindow ().min.y + 64 + random_int (400);
    }

    hdr.compression () = ZIPS_COMPRESSION;

    FrameBuffer dummy1, dummy2;

    hdr.channels () = setupBuffer (
        hdr,
        scheme._active,
        scheme._passive,
        scheme._types,
        buf,
        dummy1,
        dummy2,
        scheme._banks,
        true);

    if (scheme._views) { addMultiView (hdr, scheme.views ()); }

    remove (filename.c_str ());
    OutputFile f (filename.c_str (), hdr);
    f.setFrameBuffer (buf);
    f.writePixels (hdr.dataWindow ().max.y - hdr.dataWindow ().min.y + 1);

    return hdr.dataWindow ();
}